

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O3

Amap_Gat_t * Amap_LibFindGate(Amap_Lib_t *p,uint uTruth)

{
  Amap_Gat_t *pAVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)p->vSorted->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pAVar1 = (Amap_Gat_t *)p->vSorted->pArray[lVar3];
      if ((((pAVar1 != (Amap_Gat_t *)0x0) && (pAVar1->pFunc != (uint *)0x0)) &&
          (*(uint *)&pAVar1->field_0x38 < 0x6000000)) && (*pAVar1->pFunc == uTruth)) {
        return pAVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return (Amap_Gat_t *)0x0;
}

Assistant:

Amap_Gat_t * Amap_LibFindGate( Amap_Lib_t * p, unsigned uTruth )
{
    Amap_Gat_t * pGate;
    int i;
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if (( pGate == NULL ) || ( pGate->pFunc == NULL )) continue;
        if ( pGate->nPins <= 5 && pGate->pFunc[0] == uTruth )
            return pGate;
    }
    return NULL;
}